

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O1

void mon_lore(wchar_t oid)

{
  monster_lore *original_lore;
  textblock *tb;
  monster_race *race;
  
  if ((long)default_join[oid].oid != 0) {
    race = r_info + default_join[oid].oid;
    original_lore = get_lore(race);
    monster_race_track(player->upkeep,race);
    handle_stuff(player);
    tb = textblock_new();
    lore_description(tb,race,original_lore,false);
    textui_textblock_show(tb,(region)ZEXT816(0),(char *)0x0);
    textblock_free(tb);
    return;
  }
  __assert_fail("r_idx",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-knowledge.c"
                ,0x4cd,"void mon_lore(int)");
}

Assistant:

static void mon_lore(int oid)
{
	int r_idx;
	struct monster_race *race;
	const struct monster_lore *lore;
	textblock *tb;

	r_idx = default_item_id(oid);

	assert(r_idx);
	race = &r_info[r_idx];
	lore = get_lore(race);

	/* Update the monster recall window */
	monster_race_track(player->upkeep, race);
	handle_stuff(player);

	tb = textblock_new();
	lore_description(tb, race, lore, false);
	textui_textblock_show(tb, SCREEN_REGION, NULL);
	textblock_free(tb);
}